

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void duckdb::FullLinePosition::SanitizeError(string *value)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  vector<char,_std::allocator<char>_> char_array;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  __first._M_current = (value->_M_dataplus)._M_p;
  ::std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<char,std::allocator<char>> *)&char_array,__first,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + value->_M_string_length),(allocator_type *)local_38);
  local_38[0] = (undefined1 *)((ulong)local_38[0] & 0xffffffffffffff00);
  ::std::vector<char,_std::allocator<char>_>::emplace_back<char>(&char_array,(char *)local_38);
  Utf8Proc::MakeValid(char_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)char_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)char_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,'?');
  local_38[0] = local_28;
  ::std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)local_38,
             char_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             char_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  ::std::__cxx11::string::operator=((string *)value,(string *)local_38);
  ::std::__cxx11::string::~string((string *)local_38);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&char_array.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void FullLinePosition::SanitizeError(string &value) {
	std::vector<char> char_array(value.begin(), value.end());
	char_array.push_back('\0'); // Null-terminate the character array
	Utf8Proc::MakeValid(&char_array[0], char_array.size());
	value = {char_array.begin(), char_array.end() - 1};
}